

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSources::RTPSources(RTPSources *this,ProbationType probtype,RTPMemoryManager *mgr)

{
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSources_00144f40;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::RTPKeyHashTable(&this->sourcelist,mgr,0x20);
  this->sendercount = 0;
  this->totalcount = 0;
  this->activecount = 0;
  this->owndata = (RTPInternalSourceData *)0x0;
  this->probationtype = probtype;
  return;
}

Assistant:

RTPSources::RTPSources(ProbationType probtype,RTPMemoryManager *mgr) : RTPMemoryObject(mgr),sourcelist(mgr,RTPMEM_TYPE_CLASS_SOURCETABLEHASHELEMENT)
{
	JRTPLIB_UNUSED(probtype); // possibly unused

	totalcount = 0;
	sendercount = 0;
	activecount = 0;
	owndata = 0;
#ifdef RTP_SUPPORT_PROBATION
	probationtype = probtype;
#endif // RTP_SUPPORT_PROBATION
}